

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * __thiscall
phosg::format_data_string_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,void *vmask,
          uint64_t flags)

{
  phosg pVar1;
  byte bVar2;
  void *pvVar3;
  char *__s;
  size_t x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = ~(byte)vmask & 1;
  if (((ulong)vmask & 1) == 0) {
    pvVar3 = (void *)0x0;
    while ((pvVar3 < vdata && (bVar2 != 0))) {
      pVar1 = this[(long)pvVar3];
      if (((0xd < (byte)pVar1) || ((0x2600U >> ((byte)pVar1 & 0x1f) & 1) == 0)) &&
         ((byte)((char)pVar1 + 0x81U) < 0xa1)) {
        bVar2 = 0;
      }
      pvVar3 = (void *)((long)pvVar3 + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bVar2 == 0) {
    bVar2 = 1;
    for (pvVar3 = (void *)0x0; vdata != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
      if ((size != 0) && (!(bool)(*(char *)(size + (long)pvVar3) == '\0' ^ bVar2))) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'?');
        bVar2 = bVar2 ^ 1;
      }
      string_printf_abi_cxx11_(&local_50,"%02X",(ulong)(byte)this[(long)pvVar3]);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
    bVar2 = 1;
    for (pvVar3 = (void *)0x0; vdata != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
      if ((size != 0) && (!(bool)(*(char *)(size + (long)pvVar3) == '\0' ^ bVar2))) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"\"?\"");
        bVar2 = bVar2 ^ 1;
      }
      pVar1 = this[(long)pvVar3];
      if (pVar1 == (phosg)0x27) {
        __s = "\\\'";
LAB_0010a283:
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,__s);
      }
      else {
        if (pVar1 == (phosg)0xa) {
          __s = "\\n";
          goto LAB_0010a283;
        }
        __s = "\\r";
        if (pVar1 == (phosg)0xd) goto LAB_0010a283;
        if (pVar1 == (phosg)0x22) {
          __s = "\\\"";
          goto LAB_0010a283;
        }
        if (pVar1 == (phosg)0x9) {
          __s = "\\t";
          goto LAB_0010a283;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,(char)pVar1);
      }
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
  }
  return __return_storage_ptr__;
}

Assistant:

string format_data_string(const void* vdata, size_t size, const void* vmask, uint64_t flags) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);
  const uint8_t* mask = reinterpret_cast<const uint8_t*>(vmask);

  // If all bytes are ASCII-printable, render as a string instead
  bool is_printable = !(flags & FormatDataFlags::SKIP_STRINGS);
  if (is_printable) {
    for (size_t z = 0; z < size && is_printable; z++) {
      if (data[z] != '\r' && data[z] != '\n' && data[z] != '\t' && (data[z] < 0x20 || data[z] > 0x7E)) {
        is_printable = false;
      }
    }
  }

  string ret;
  bool mask_enabled = true;
  if (is_printable) {
    ret += '\"';
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += "\"?\"";
      }
      if (data[x] == '\r') {
        ret += "\\r";
      } else if (data[x] == '\t') {
        ret += "\\t";
      } else if (data[x] == '\n') {
        ret += "\\n";
      } else if (data[x] == '\"') {
        ret += "\\\"";
      } else if (data[x] == '\'') {
        ret += "\\\'";
      } else {
        ret.push_back(data[x]);
      }
    }
    ret += '\"';
  } else {
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += '?';
      }
      ret += string_printf("%02X", data[x]);
    }
  }
  return ret;
}